

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar23 [64];
  undefined1 auVar22 [32];
  
  uVar4 = a->c;
  iVar14 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar11 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar11 = 0;
    uVar20 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar20 = 0;
    }
    for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
      lVar13 = a->elemsize * a->cstep * uVar12;
      pvVar5 = a->data;
      lVar15 = b->elemsize * b->cstep * uVar12;
      pvVar6 = b->data;
      lVar16 = c->elemsize * c->cstep * uVar12;
      pvVar7 = c->data;
      lVar17 = 0;
      lVar18 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar14; iVar19 = iVar19 + 8) {
        auVar2 = *(undefined1 (*) [32])((long)pvVar6 + lVar18 + lVar15);
        auVar9 = vrcpps_avx(auVar2);
        auVar3 = *(undefined1 (*) [32])((long)pvVar5 + lVar18 + lVar13);
        auVar23._0_4_ = auVar3._0_4_ * auVar9._0_4_;
        auVar23._4_4_ = auVar3._4_4_ * auVar9._4_4_;
        auVar23._8_4_ = auVar3._8_4_ * auVar9._8_4_;
        auVar23._12_4_ = auVar3._12_4_ * auVar9._12_4_;
        auVar23._16_4_ = auVar3._16_4_ * auVar9._16_4_;
        auVar23._20_4_ = auVar3._20_4_ * auVar9._20_4_;
        auVar23._28_36_ = in_ZMM3._28_36_;
        auVar23._24_4_ = auVar3._24_4_ * auVar9._24_4_;
        auVar22 = auVar23._0_32_;
        in_ZMM3 = ZEXT3264(auVar22);
        auVar10 = vfmsub213ps_fma(auVar2,auVar22,auVar3);
        auVar10 = vfnmadd213ps_fma(ZEXT1632(auVar10),auVar9,auVar22);
        *(undefined1 (*) [32])((long)pvVar7 + lVar18 + lVar16) = ZEXT1632(auVar10);
        lVar18 = lVar18 + 0x20;
        lVar17 = lVar17 + 8;
      }
      for (; iVar19 + 3 < iVar14; iVar19 = iVar19 + 4) {
        auVar10 = *(undefined1 (*) [16])((long)pvVar5 + lVar18 + lVar13);
        auVar1 = *(undefined1 (*) [16])((long)pvVar6 + lVar18 + lVar15);
        auVar8 = vrcpps_avx(auVar1);
        auVar21._0_4_ = auVar10._0_4_ * auVar8._0_4_;
        auVar21._4_4_ = auVar10._4_4_ * auVar8._4_4_;
        auVar21._8_4_ = auVar10._8_4_ * auVar8._8_4_;
        auVar21._12_4_ = auVar10._12_4_ * auVar8._12_4_;
        in_ZMM3 = ZEXT1664(auVar21);
        auVar10 = vfmsub213ps_fma(auVar1,auVar21,auVar10);
        auVar10 = vfnmadd213ps_fma(auVar10,auVar8,auVar21);
        *(undefined1 (*) [16])((long)pvVar7 + lVar18 + lVar16) = auVar10;
        lVar18 = lVar18 + 0x10;
        lVar17 = lVar17 + 4;
      }
      for (; (int)lVar17 < iVar14; lVar17 = lVar17 + 1) {
        *(float *)((long)pvVar7 + lVar17 * 4 + lVar16) =
             *(float *)((long)pvVar5 + lVar17 * 4 + lVar13) /
             *(float *)((long)pvVar6 + lVar17 * 4 + lVar15);
      }
    }
  }
  return iVar11;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}